

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool __thiscall
bloaty::RangeSink::ContainsVerboseVMAddr(RangeSink *this,uint64_t vmaddr,uint64_t vmsize)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->options_).verbose_level_ < 2) {
    if ((((this->options_)._has_bits_.has_bits_[0] & 0x40) != 0) &&
       (uVar1 = (this->options_).debug_vmaddr_, vmaddr <= uVar1)) {
      return uVar1 < vmsize + vmaddr;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RangeSink::ContainsVerboseVMAddr(uint64_t vmaddr, uint64_t vmsize) {
  return options_.verbose_level() > 1 ||
         (options_.has_debug_vmaddr() && options_.debug_vmaddr() >= vmaddr &&
          options_.debug_vmaddr() < (vmaddr + vmsize));
}